

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

bool __thiscall
asmjit::v1_14::BitVectorRangeIterator<unsigned_long,_0U>::nextRange
          (BitVectorRangeIterator<unsigned_long,_0U> *this,size_t *rangeStart,size_t *rangeEnd,
          size_t rangeHint)

{
  unsigned_long *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong local_178;
  ulong local_170;
  ulong local_160;
  ulong local_158;
  size_t j_1;
  size_t j;
  size_t i;
  size_t rangeHint_local;
  
  while (this->_bitWord == 0) {
    this->_idx = this->_idx + 0x40;
    if (this->_end <= this->_idx) {
      return false;
    }
    puVar1 = this->_ptr;
    this->_ptr = puVar1 + 1;
    this->_bitWord = puVar1[1] ^ 0xffffffffffffffff;
  }
  uVar2 = 0;
  for (uVar3 = this->_bitWord; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
    uVar2 = uVar2 + 1;
  }
  *rangeStart = this->_idx + (ulong)uVar2;
  this->_bitWord =
       this->_bitWord ^ -1L << ((byte)uVar2 & 0x3f) ^ 0xffffffffffffffffU ^ 0xffffffffffffffff;
  if (this->_bitWord == 0) {
    local_158 = this->_idx + 0x40;
    if (this->_end < local_158) {
      local_158 = this->_end;
    }
    *rangeEnd = local_158;
    while( true ) {
      if (rangeHint <= *rangeEnd - *rangeStart) {
        return true;
      }
      this->_idx = this->_idx + 0x40;
      if (this->_end <= this->_idx) break;
      puVar1 = this->_ptr;
      this->_ptr = puVar1 + 1;
      this->_bitWord = puVar1[1] ^ 0xffffffffffffffff;
      if (this->_bitWord != 0xffffffffffffffff) {
        uVar2 = 0;
        for (uVar3 = this->_bitWord ^ 0xffffffffffffffff; (uVar3 & 1) == 0;
            uVar3 = uVar3 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        local_160 = this->_idx + (ulong)uVar2;
        if (this->_end < local_160) {
          local_160 = this->_end;
        }
        *rangeEnd = local_160;
        this->_bitWord = this->_bitWord ^ -1L << ((byte)uVar2 & 0x3f) ^ 0xffffffffffffffffU;
        return true;
      }
      local_170 = this->_idx + 0x40;
      if (this->_end < local_170) {
        local_170 = this->_end;
      }
      *rangeEnd = local_170;
      this->_bitWord = 0;
    }
    return true;
  }
  uVar2 = 0;
  for (uVar3 = this->_bitWord; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
    uVar2 = uVar2 + 1;
  }
  local_178 = this->_idx + (ulong)uVar2;
  if (this->_end < local_178) {
    local_178 = this->_end;
  }
  *rangeEnd = local_178;
  this->_bitWord =
       this->_bitWord ^ -1L << ((byte)uVar2 & 0x3f) ^ 0xffffffffffffffffU ^ 0xffffffffffffffff;
  return true;
}

Assistant:

ASMJIT_FORCE_INLINE bool nextRange(size_t* rangeStart, size_t* rangeEnd, size_t rangeHint = std::numeric_limits<size_t>::max()) noexcept {
    // Skip all empty BitWords.
    while (_bitWord == 0) {
      _idx += kBitWordSize;
      if (_idx >= _end)
        return false;
      _bitWord = (*++_ptr) ^ kXorMask;
    }

    size_t i = Support::ctz(_bitWord);

    *rangeStart = _idx + i;
    _bitWord = ~(_bitWord ^ ~(Support::allOnes<T>() << i));

    if (_bitWord == 0) {
      *rangeEnd = Support::min(_idx + kBitWordSize, _end);
      while (*rangeEnd - *rangeStart < rangeHint) {
        _idx += kBitWordSize;
        if (_idx >= _end)
          break;

        _bitWord = (*++_ptr) ^ kXorMask;
        if (_bitWord != Support::allOnes<T>()) {
          size_t j = Support::ctz(~_bitWord);
          *rangeEnd = Support::min(_idx + j, _end);
          _bitWord = _bitWord ^ ~(Support::allOnes<T>() << j);
          break;
        }

        *rangeEnd = Support::min(_idx + kBitWordSize, _end);
        _bitWord = 0;
        continue;
      }

      return true;
    }
    else {
      size_t j = Support::ctz(_bitWord);
      *rangeEnd = Support::min(_idx + j, _end);

      _bitWord = ~(_bitWord ^ ~(Support::allOnes<T>() << j));
      return true;
    }
  }